

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

wchar_t next_entry(archive_read_disk *a,tree *t,archive_entry *entry)

{
  undefined8 uVar1;
  wchar_t wVar2;
  mode_t mVar3;
  int iVar4;
  uint *puVar5;
  char *pcVar6;
  stat_conflict *st_00;
  time_t tVar7;
  long lVar8;
  archive_entry *in_RDX;
  tree *in_RSI;
  archive *in_RDI;
  stat_conflict *in_stack_00000030;
  int in_stack_0000003c;
  archive_entry *in_stack_00000040;
  archive *in_stack_00000048;
  wchar_t r;
  wchar_t descend;
  char *name;
  stat_conflict *lst;
  stat_conflict *st;
  tree *in_stack_ffffffffffffff38;
  archive_entry *in_stack_ffffffffffffff40;
  archive *in_stack_ffffffffffffff48;
  archive *a_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar9;
  archive_read_disk *in_stack_ffffffffffffff58;
  wchar_t local_3c;
  stat_conflict *local_30;
  wchar_t local_4;
  
  local_30 = (stat_conflict *)0x0;
  in_RSI->descend = 0;
  do {
    wVar2 = tree_next(in_stack_ffffffffffffff38);
    switch(wVar2) {
    case L'\0':
      tree_enter_initial_dir((tree *)in_stack_ffffffffffffff40);
      return L'\x01';
    case L'\x01':
      local_30 = tree_current_lstat(in_stack_ffffffffffffff38);
      if (local_30 == (stat_conflict *)0x0) {
        puVar5 = (uint *)__errno_location();
        uVar9 = *puVar5;
        pcVar6 = tree_current_path(in_RSI);
        archive_set_error(in_RDI,(int)(ulong)uVar9,"%s: Cannot stat",pcVar6);
        tree_enter_initial_dir((tree *)in_stack_ffffffffffffff40);
        return L'\xffffffe7';
      }
      break;
    case L'\x02':
    case L'\x03':
      break;
    case L'\xfffffffe':
      uVar9 = in_RSI->tree_errno;
      pcVar6 = tree_current_path(in_RSI);
      archive_set_error(in_RDI,(int)(ulong)uVar9,"%s: Unable to continue traversing directory tree",
                        pcVar6);
      in_RDI->state = 0x8000;
      tree_enter_initial_dir((tree *)in_stack_ffffffffffffff40);
      return L'\xffffffe2';
    case L'\xffffffff':
      pcVar6 = tree_current_path(in_RSI);
      archive_set_error(in_RDI,-1,"%s: Couldn\'t visit directory",pcVar6);
      tree_enter_initial_dir((tree *)in_stack_ffffffffffffff40);
      return L'\xffffffe7';
    }
  } while (local_30 == (stat_conflict *)0x0);
  tree_current_path(in_RSI);
  archive_entry_copy_pathname(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  if (in_RDI[2].vtable != (archive_vtable_conflict *)0x0) {
    wVar2 = archive_match_path_excluded
                      (&in_stack_ffffffffffffff58->archive,
                       (archive_entry *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (wVar2 < L'\0') {
      puVar5 = (uint *)__errno_location();
      uVar9 = *puVar5;
      pcVar6 = archive_error_string((archive *)in_RDI[2].vtable);
      archive_set_error(in_RDI,(int)(ulong)uVar9,"Faild : %s",pcVar6);
      return wVar2;
    }
    if (wVar2 != L'\0') {
      if (*(long *)&in_RDI[2].archive_format != 0) {
        (**(code **)&in_RDI[2].archive_format)(in_RDI,in_RDI[2].archive_format_name,in_RDX);
      }
      return L'\xfffffff6';
    }
  }
  if (in_RSI->symlink_mode == 'H') {
    in_RSI->symlink_mode = 'P';
LAB_00122908:
    local_3c = tree_current_is_dir(in_stack_ffffffffffffff38);
    *(undefined1 *)&in_RDI[1].magic = 0x4c;
    *(undefined1 *)((long)&in_RDI[1].magic + 1) = 1;
    st_00 = tree_current_stat(in_stack_ffffffffffffff38);
    if ((st_00 != (stat_conflict *)0x0) &&
       (wVar2 = tree_target_is_same_as_parent(in_RSI,st_00), wVar2 == L'\0')) goto LAB_001229ae;
  }
  else if (in_RSI->symlink_mode == 'L') goto LAB_00122908;
  local_3c = tree_current_is_physical_dir(in_stack_ffffffffffffff38);
  *(undefined1 *)&in_RDI[1].magic = 0x50;
  *(undefined1 *)((long)&in_RDI[1].magic + 1) = 0;
LAB_001229ae:
  wVar2 = update_current_filesystem
                    (in_stack_ffffffffffffff58,
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (wVar2 == L'\0') {
    if (in_RSI->initial_filesystem_id == -1) {
      in_RSI->initial_filesystem_id = in_RSI->current_filesystem_id;
    }
    if ((in_RDI[1].archive_error_number == 0) &&
       (in_RSI->initial_filesystem_id != in_RSI->current_filesystem_id)) {
      local_4 = L'\xfffffff6';
    }
    else {
      in_RSI->descend = local_3c;
      archive_entry_copy_stat(in_stack_ffffffffffffff40,(stat_conflict *)in_stack_ffffffffffffff38);
      tVar7 = archive_entry_mtime(in_RDX);
      (in_RSI->restore_time).mtime = tVar7;
      lVar8 = archive_entry_mtime_nsec(in_RDX);
      (in_RSI->restore_time).mtime_nsec = lVar8;
      tVar7 = archive_entry_atime(in_RDX);
      (in_RSI->restore_time).atime = tVar7;
      lVar8 = archive_entry_atime_nsec(in_RDX);
      (in_RSI->restore_time).atime_nsec = lVar8;
      mVar3 = archive_entry_filetype(in_RDX);
      (in_RSI->restore_time).filetype = mVar3;
      (in_RSI->restore_time).noatime = in_RSI->current_filesystem->noatime;
      if (in_RDI[2].vtable != (archive_vtable_conflict *)0x0) {
        wVar2 = archive_match_time_excluded(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        if (wVar2 < L'\0') {
          puVar5 = (uint *)__errno_location();
          uVar9 = *puVar5;
          pcVar6 = archive_error_string((archive *)in_RDI[2].vtable);
          archive_set_error(in_RDI,(int)(ulong)uVar9,"Faild : %s",pcVar6);
          return wVar2;
        }
        if (wVar2 != L'\0') {
          if (*(long *)&in_RDI[2].archive_format != 0) {
            (**(code **)&in_RDI[2].archive_format)(in_RDI,in_RDI[2].archive_format_name,in_RDX);
          }
          return L'\xfffffff6';
        }
      }
      archive_entry_uid(in_RDX);
      pcVar6 = archive_read_disk_uname(in_stack_ffffffffffffff48,(int64_t)in_stack_ffffffffffffff40)
      ;
      if (pcVar6 != (char *)0x0) {
        archive_entry_copy_uname(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      }
      archive_entry_gid(in_RDX);
      pcVar6 = archive_read_disk_gname(in_stack_ffffffffffffff48,(int64_t)in_stack_ffffffffffffff40)
      ;
      if (pcVar6 != (char *)0x0) {
        archive_entry_copy_gname(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      }
      if (in_RDI[2].vtable != (archive_vtable_conflict *)0x0) {
        wVar2 = archive_match_owner_excluded(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        if (wVar2 < L'\0') {
          a_00 = in_RDI;
          puVar5 = (uint *)__errno_location();
          uVar9 = *puVar5;
          pcVar6 = archive_error_string((archive *)in_RDI[2].vtable);
          archive_set_error(a_00,(int)(ulong)uVar9,"Faild : %s",pcVar6);
          return wVar2;
        }
        if (wVar2 != L'\0') {
          if (*(long *)&in_RDI[2].archive_format != 0) {
            (**(code **)&in_RDI[2].archive_format)(in_RDI,in_RDI[2].archive_format_name,in_RDX);
          }
          return L'\xfffffff6';
        }
      }
      if ((in_RDI[1].sconv == (archive_string_conv *)0x0) ||
         (uVar1._0_4_ = in_RDI[2].magic, uVar1._4_4_ = in_RDI[2].state,
         iVar4 = (*(code *)in_RDI[1].sconv)(in_RDI,uVar1,in_RDX), iVar4 != 0)) {
        tree_current_access_path(in_RSI);
        archive_entry_copy_sourcepath(in_RDX,(char *)in_stack_ffffffffffffff38);
        local_4 = archive_read_disk_entry_from_file
                            (in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000030
                            );
      }
      else {
        local_4 = L'\xfffffff6';
      }
    }
  }
  else {
    in_RDI->state = 0x8000;
    tree_enter_initial_dir((tree *)in_stack_ffffffffffffff40);
    local_4 = L'\xffffffe2';
  }
  return local_4;
}

Assistant:

static struct links_entry *
next_entry(struct archive_entry_linkresolver *res, int mode)
{
	struct links_entry	*le;
	size_t			 bucket;

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	/* Look for next non-empty bucket in the links cache. */
	for (bucket = 0; bucket < res->number_buckets; bucket++) {
		for (le = res->buckets[bucket]; le != NULL; le = le->next) {
			if (le->entry != NULL &&
			    (mode & NEXT_ENTRY_DEFERRED) == 0)
				continue;
			if (le->entry == NULL &&
			    (mode & NEXT_ENTRY_PARTIAL) == 0)
				continue;
			/* Remove it from this hash bucket. */
			if (le->next != NULL)
				le->next->previous = le->previous;
			if (le->previous != NULL)
				le->previous->next = le->next;
			else
				res->buckets[bucket] = le->next;
			res->number_entries--;
			/* Defer freeing this entry. */
			res->spare = le;
			return (le);
		}
	}
	return (NULL);
}